

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

void djgc_stop(djg_clock *clock)

{
  long in_RAX;
  GLint64 now;
  GLint64 local_18;
  
  if (clock != (djg_clock *)0x0) {
    local_18 = in_RAX;
    if (clock->is_cpu_ticking != 0) {
      local_18 = 0;
      (*glad_glGetInteger64v)(0x8e28,&local_18);
      clock->cpu_ticks = (double)(local_18 - clock->cpu_start_ticks) / 1000000000.0;
      clock->is_cpu_ticking = 0;
    }
    if ((clock->is_gpu_ticking != 0) && (clock->is_gpu_ready != 0)) {
      (*glad_glQueryCounter)(clock->queries[1],0x8e28);
      clock->is_gpu_ticking = 0;
    }
    return;
  }
  __assert_fail("clock",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x124,"void djgc_stop(djg_clock *)");
}

Assistant:

DJGDEF void djgc_stop(djg_clock *clock)
{
    DJG_ASSERT(clock);
    if (clock->is_cpu_ticking) {
        GLint64 now = 0;

        glGetInteger64v(GL_TIMESTAMP, &now);
        clock->cpu_ticks = (now - clock->cpu_start_ticks) / 1e9;
        clock->is_cpu_ticking = GL_FALSE;
    }
    if (clock->is_gpu_ticking && clock->is_gpu_ready) {
        glQueryCounter(clock->queries[DJGC__QUERY_STOP], GL_TIMESTAMP);
        clock->is_gpu_ticking = GL_FALSE;
    }
}